

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_subgroup_op(CompilerGLSL *this,Instruction *i)

{
  ushort uVar1;
  uint32_t result_id;
  bool bVar2;
  uint32_t uVar3;
  BaseType input_type;
  BaseType BVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  SPIRType *pSVar7;
  runtime_error *prVar8;
  int iVar9;
  Feature feature;
  uint32_t uVar10;
  char *pcVar11;
  string local_50;
  
  puVar6 = Compiler::stream(&this->super_Compiler,i);
  uVar1 = i->op;
  if (((this->options).vulkan_semantics == false) &&
     (bVar2 = is_supported_subgroup_op_in_opengl((uint)uVar1), !bVar2)) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"This subgroup operation is only supported in Vulkan semantics.",
               "");
    ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
    *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar3 = get_integer_width_for_instruction(this,i);
  input_type = to_signed_basetype(uVar3);
  BVar4 = to_unsigned_basetype(uVar3);
  iVar9 = uVar1 - OpGroupNonUniformElect;
  switch(iVar9) {
  case 0:
    feature = SubgroupElect;
    break;
  case 1:
  case 2:
  case 3:
    pSVar7 = Compiler::expression_type(&this->super_Compiler,puVar6[3]);
    if ((*(int *)&(pSVar7->super_IVariant).field_0xc == 2) && (pSVar7->vecsize == 1)) {
      feature = SubgroupAll_Any_AllEqualBool;
    }
    else {
      feature = SubgroupAllEqualT;
    }
    break;
  case 4:
  case 5:
    feature = SubgroupBroadcast_First;
    break;
  case 6:
    feature = SubgroupBallot;
    break;
  case 7:
switchD_001f8612_caseD_7:
    feature = SubgroupInverseBallot_InclBitCount_ExclBitCout;
    break;
  case 8:
    feature = SubgroupBallotBitExtract;
    break;
  case 9:
    if (puVar6[3] == 0) {
      feature = SubgroupBallotBitCount;
      break;
    }
    if (puVar6[3] < 3) goto switchD_001f8612_caseD_7;
    goto LAB_001f87bb;
  case 10:
  case 0xb:
    feature = SubgroupBallotFindLSB_MSB;
    break;
  case 0xc:
  case 0xd:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_KHR_shader_subgroup_shuffle","");
    require_extension_internal(this,&local_50);
    goto LAB_001f875e;
  case 0xe:
  case 0xf:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_KHR_shader_subgroup_shuffle_relative","");
    require_extension_internal(this,&local_50);
    goto LAB_001f875e;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    if (puVar6[3] == 3) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered","");
      require_extension_internal(this,&local_50);
    }
    else {
      if (2 < puVar6[3]) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Invalid group operation.","");
        ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
        *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_arithmetic","");
      require_extension_internal(this,&local_50);
    }
    goto LAB_001f875e;
  case 0x20:
  case 0x21:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_KHR_shader_subgroup_quad","");
    require_extension_internal(this,&local_50);
LAB_001f875e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_001f87bb;
  default:
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Invalid opcode for subgroup.","");
    ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
    *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  request_subgroup_feature(this,feature);
LAB_001f87bb:
  uVar3 = *puVar6;
  result_id = puVar6[1];
  uVar5 = Compiler::evaluate_constant_u32(&this->super_Compiler,puVar6[2]);
  if (uVar5 != 3) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Only subgroup scope is supported.","");
    ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
    *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  switch(iVar9) {
  case 0:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"subgroupElect()","");
    emit_op(this,uVar3,result_id,&local_50,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_001f8ed7;
  case 1:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupAll";
    break;
  case 2:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupAny";
    break;
  case 3:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupAllEqual";
    break;
  case 4:
    uVar5 = puVar6[3];
    uVar10 = puVar6[4];
    pcVar11 = "subgroupBroadcast";
    goto LAB_001f8ea8;
  case 5:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupBroadcastFirst";
    break;
  case 6:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupBallot";
    break;
  case 7:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupInverseBallot";
    break;
  case 8:
    uVar5 = puVar6[3];
    uVar10 = puVar6[4];
    pcVar11 = "subgroupBallotBitExtract";
    goto LAB_001f8ea8;
  case 9:
    uVar5 = puVar6[3];
    if (uVar5 == 2) {
      uVar5 = puVar6[4];
      pcVar11 = "subgroupBallotExclusiveBitCount";
    }
    else if (uVar5 == 1) {
      uVar5 = puVar6[4];
      pcVar11 = "subgroupBallotInclusiveBitCount";
    }
    else {
      if (uVar5 != 0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Invalid BitCount operation.","");
        ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
        *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[4];
      pcVar11 = "subgroupBallotBitCount";
    }
    break;
  case 10:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupBallotFindLSB";
    break;
  case 0xb:
    uVar5 = puVar6[3];
    pcVar11 = "subgroupBallotFindMSB";
    break;
  case 0xc:
    uVar5 = puVar6[3];
    uVar10 = puVar6[4];
    pcVar11 = "subgroupShuffle";
    goto LAB_001f8ea8;
  case 0xd:
    uVar5 = puVar6[3];
    uVar10 = puVar6[4];
    pcVar11 = "subgroupShuffleXor";
    goto LAB_001f8ea8;
  case 0xe:
    uVar5 = puVar6[3];
    uVar10 = puVar6[4];
    pcVar11 = "subgroupShuffleUp";
    goto LAB_001f8ea8;
  case 0xf:
    uVar5 = puVar6[3];
    uVar10 = puVar6[4];
    pcVar11 = "subgroupShuffleDown";
    goto LAB_001f8ea8;
  case 0x10:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8a26_caseD_0;
    case 1:
switchD_001f8a26_caseD_1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveAdd";
      break;
    case 2:
switchD_001f8a26_caseD_2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveAdd";
      break;
    case 3:
switchD_001f8a26_caseD_3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      pcVar11 = "subgroupClusteredAdd";
      goto LAB_001f8ea8;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x11:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8a26_caseD_0;
    case 1:
      goto switchD_001f8a26_caseD_1;
    case 2:
      goto switchD_001f8a26_caseD_2;
    case 3:
      goto switchD_001f8a26_caseD_3;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x12:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8b9e_caseD_0;
    case 1:
switchD_001f8b9e_caseD_1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveMul";
      break;
    case 2:
switchD_001f8b9e_caseD_2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveMul";
      break;
    case 3:
switchD_001f8b9e_caseD_3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      pcVar11 = "subgroupClusteredMul";
      goto LAB_001f8ea8;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x13:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8b9e_caseD_0;
    case 1:
      goto switchD_001f8b9e_caseD_1;
    case 2:
      goto switchD_001f8b9e_caseD_2;
    case 3:
      goto switchD_001f8b9e_caseD_3;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x14:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupMin";
      break;
    case 1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveMin";
      break;
    case 2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveMin";
      break;
    case 3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
LAB_001f8e49:
      pcVar11 = "subgroupClusteredMin";
LAB_001f8f14:
      emit_binary_func_op_cast_clustered(this,uVar3,result_id,uVar5,uVar10,pcVar11,input_type);
      goto LAB_001f8ed7;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_001f8f45;
  case 0x15:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupMin";
      input_type = BVar4;
      break;
    case 1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveMin";
      input_type = BVar4;
      break;
    case 2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveMin";
      input_type = BVar4;
      break;
    case 3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      input_type = BVar4;
      goto LAB_001f8e49;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_001f8f45;
  case 0x16:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupMin";
      break;
    case 1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveMin";
      break;
    case 2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveMin";
      break;
    case 3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      pcVar11 = "subgroupClusteredMin";
      goto LAB_001f8ea8;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x17:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupMax";
      break;
    case 1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveMax";
      break;
    case 2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveMax";
      break;
    case 3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
LAB_001f8f0d:
      pcVar11 = "subgroupClusteredMax";
      goto LAB_001f8f14;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_001f8f45;
  case 0x18:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupMax";
      input_type = BVar4;
      break;
    case 1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveMax";
      input_type = BVar4;
      break;
    case 2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveMax";
      input_type = BVar4;
      break;
    case 3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      input_type = BVar4;
      goto LAB_001f8f0d;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_001f8f45:
    emit_unary_func_op_cast(this,uVar3,result_id,uVar5,pcVar11,input_type,input_type);
    goto LAB_001f8ed7;
  case 0x19:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupMax";
      break;
    case 1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveMax";
      break;
    case 2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveMax";
      break;
    case 3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      pcVar11 = "subgroupClusteredMax";
      goto LAB_001f8ea8;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x1a:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8c2c_caseD_0;
    case 1:
switchD_001f8c2c_caseD_1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveAnd";
      break;
    case 2:
switchD_001f8c2c_caseD_2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveAnd";
      break;
    case 3:
switchD_001f8c2c_caseD_3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      pcVar11 = "subgroupClusteredAnd";
      goto LAB_001f8ea8;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x1b:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8b2e_caseD_0;
    case 1:
switchD_001f8b2e_caseD_1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveOr";
      break;
    case 2:
switchD_001f8b2e_caseD_2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveOr";
      break;
    case 3:
switchD_001f8b2e_caseD_3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      pcVar11 = "subgroupClusteredOr";
      goto LAB_001f8ea8;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x1c:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8a08_caseD_0;
    case 1:
switchD_001f8a08_caseD_1:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupInclusiveXor";
      break;
    case 2:
switchD_001f8a08_caseD_2:
      uVar5 = puVar6[4];
      pcVar11 = "subgroupExclusiveXor";
      break;
    case 3:
switchD_001f8a08_caseD_3:
      uVar5 = puVar6[4];
      uVar10 = puVar6[5];
      pcVar11 = "subgroupClusteredXor";
      goto LAB_001f8ea8;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x1d:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8c2c_caseD_0;
    case 1:
      goto switchD_001f8c2c_caseD_1;
    case 2:
      goto switchD_001f8c2c_caseD_2;
    case 3:
      goto switchD_001f8c2c_caseD_3;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x1e:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8b2e_caseD_0;
    case 1:
      goto switchD_001f8b2e_caseD_1;
    case 2:
      goto switchD_001f8b2e_caseD_2;
    case 3:
      goto switchD_001f8b2e_caseD_3;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x1f:
    switch(puVar6[3]) {
    case 0:
      goto switchD_001f8a08_caseD_0;
    case 1:
      goto switchD_001f8a08_caseD_1;
    case 2:
      goto switchD_001f8a08_caseD_2;
    case 3:
      goto switchD_001f8a08_caseD_3;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid group operation.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x20:
    uVar5 = puVar6[3];
    uVar10 = puVar6[4];
    pcVar11 = "subgroupQuadBroadcast";
LAB_001f8ea8:
    emit_binary_func_op(this,uVar3,result_id,uVar5,uVar10,pcVar11);
    goto LAB_001f8ed7;
  case 0x21:
    uVar5 = Compiler::evaluate_constant_u32(&this->super_Compiler,puVar6[4]);
    if (uVar5 == 2) {
      uVar5 = puVar6[3];
      pcVar11 = "subgroupQuadSwapDiagonal";
    }
    else if (uVar5 == 1) {
      uVar5 = puVar6[3];
      pcVar11 = "subgroupQuadSwapVertical";
    }
    else {
      if (uVar5 != 0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Invalid quad swap direction.","");
        ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
        *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[3];
      pcVar11 = "subgroupQuadSwapHorizontal";
    }
    break;
  default:
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Invalid opcode for subgroup.","");
    ::std::runtime_error::runtime_error(prVar8,(string *)&local_50);
    *(undefined ***)prVar8 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_001f8ec6:
  emit_unary_func_op(this,uVar3,result_id,uVar5,pcVar11);
LAB_001f8ed7:
  register_control_dependent_expression(this,result_id);
  return;
switchD_001f8a08_caseD_0:
  uVar5 = puVar6[4];
  pcVar11 = "subgroupXor";
  goto LAB_001f8ec6;
switchD_001f8b2e_caseD_0:
  uVar5 = puVar6[4];
  pcVar11 = "subgroupOr";
  goto LAB_001f8ec6;
switchD_001f8c2c_caseD_0:
  uVar5 = puVar6[4];
  pcVar11 = "subgroupAnd";
  goto LAB_001f8ec6;
switchD_001f8b9e_caseD_0:
  uVar5 = puVar6[4];
  pcVar11 = "subgroupMul";
  goto LAB_001f8ec6;
switchD_001f8a26_caseD_0:
  uVar5 = puVar6[4];
  pcVar11 = "subgroupAdd";
  goto LAB_001f8ec6;
}

Assistant:

void CompilerGLSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (!options.vulkan_semantics && !is_supported_subgroup_op_in_opengl(op))
		SPIRV_CROSS_THROW("This subgroup operation is only supported in Vulkan semantics.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case OpGroupNonUniformElect:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupElect);
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitCount);
		else if (operation == GroupOperationInclusiveScan || operation == GroupOperationExclusiveScan)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
	}
	break;

	case OpGroupNonUniformBallotBitExtract:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitExtract);
		break;

	case OpGroupNonUniformInverseBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
		break;

	case OpGroupNonUniformBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallot);
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotFindLSB_MSB);
		break;

	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBroadcast_First);
		break;

	case OpGroupNonUniformShuffle:
	case OpGroupNonUniformShuffleXor:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle");
		break;

	case OpGroupNonUniformShuffleUp:
	case OpGroupNonUniformShuffleDown:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle_relative");
		break;

	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	{
		const SPIRType &type = expression_type(ops[3]);
		if (type.basetype == SPIRType::BaseType::Boolean && type.vecsize == 1u)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAll_Any_AllEqualBool);
		else
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAllEqualT);
	}
	break;

	case OpGroupNonUniformFAdd:
	case OpGroupNonUniformFMul:
	case OpGroupNonUniformFMin:
	case OpGroupNonUniformFMax:
	case OpGroupNonUniformIAdd:
	case OpGroupNonUniformIMul:
	case OpGroupNonUniformSMin:
	case OpGroupNonUniformSMax:
	case OpGroupNonUniformUMin:
	case OpGroupNonUniformUMax:
	case OpGroupNonUniformBitwiseAnd:
	case OpGroupNonUniformBitwiseOr:
	case OpGroupNonUniformBitwiseXor:
	case OpGroupNonUniformLogicalAnd:
	case OpGroupNonUniformLogicalOr:
	case OpGroupNonUniformLogicalXor:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationClusteredReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_clustered");
		}
		else if (operation == GroupOperationExclusiveScan || operation == GroupOperationInclusiveScan ||
		         operation == GroupOperationReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_arithmetic");
		}
		else
			SPIRV_CROSS_THROW("Invalid group operation.");
		break;
	}

	case OpGroupNonUniformQuadSwap:
	case OpGroupNonUniformQuadBroadcast:
		require_extension_internal("GL_KHR_shader_subgroup_quad");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "subgroupElect()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupInverseBallot");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAll");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAny");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAllEqual");
		break;

		// clang-format off
#define GLSL_GROUP_OP(op, glsl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "subgroup" #glsl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupInclusive" #glsl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupExclusive" #glsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define GLSL_GROUP_OP_CAST(op, glsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroup" #glsl_op, type, type); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupInclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupExclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op_cast_clustered(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	GLSL_GROUP_OP(FAdd, Add)
	GLSL_GROUP_OP(FMul, Mul)
	GLSL_GROUP_OP(FMin, Min)
	GLSL_GROUP_OP(FMax, Max)
	GLSL_GROUP_OP(IAdd, Add)
	GLSL_GROUP_OP(IMul, Mul)
	GLSL_GROUP_OP_CAST(SMin, Min, int_type)
	GLSL_GROUP_OP_CAST(SMax, Max, int_type)
	GLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	GLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	GLSL_GROUP_OP(BitwiseAnd, And)
	GLSL_GROUP_OP(BitwiseOr, Or)
	GLSL_GROUP_OP(BitwiseXor, Xor)
	GLSL_GROUP_OP(LogicalAnd, And)
	GLSL_GROUP_OP(LogicalOr, Or)
	GLSL_GROUP_OP(LogicalXor, Xor)
#undef GLSL_GROUP_OP
#undef GLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapHorizontal");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapVertical");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupQuadBroadcast");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}